

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args;
  SyntaxList<slang::syntax::MemberSyntax> *args_3;
  AnonymousProgramSyntax *pAVar1;
  Token local_60;
  Token local_50;
  Token local_40;
  
  args = deepClone<slang::syntax::AttributeInstanceSyntax>
                   ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                    (BumpAllocator *)__child_stack);
  local_40 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  local_50 = parsing::Token::deepClone((Token *)(__fn + 0x60),(BumpAllocator *)__child_stack);
  args_3 = deepClone<slang::syntax::MemberSyntax>
                     ((SyntaxList<slang::syntax::MemberSyntax> *)(__fn + 0x70),
                      (BumpAllocator *)__child_stack);
  local_60 = parsing::Token::deepClone((Token *)(__fn + 0xa8),(BumpAllocator *)__child_stack);
  pAVar1 = BumpAllocator::
           emplace<slang::syntax::AnonymousProgramSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
                     ((BumpAllocator *)__child_stack,args,&local_40,&local_50,args_3,&local_60);
  return (int)pAVar1;
}

Assistant:

static SyntaxNode* clone(const AnonymousProgramSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<AnonymousProgramSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        node.semi.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.endkeyword.deepClone(alloc)
    );
}